

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction.h
# Opt level: O0

void ximu::PacketConstruction::
     constructCommandPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (CommandCodes commandCode,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  initializer_list<unsigned_char> __l;
  uchar uVar1;
  iterator iVar2;
  size_type sVar3;
  reference pvVar4;
  iterator end;
  allocator<unsigned_char> local_45;
  uchar local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  CommandCodes commandCode_local;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> dest_local;
  
  local_44 = '\x01';
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = (undefined1)(commandCode >> 8);
  local_43 = decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._5_1_;
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = (undefined1)commandCode;
  local_42 = decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_1_;
  local_41 = 0;
  local_40 = &local_44;
  local_38 = 4;
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = commandCode;
  std::allocator<unsigned_char>::allocator(&local_45);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,__l,&local_45);
  std::allocator<unsigned_char>::~allocator(&local_45);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  uVar1 = checksum<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )iVar2._M_current,sVar3 - 1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  *pvVar4 = uVar1;
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  PacketEncoding::
  encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )iVar2._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )end._M_current,dest);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

static void constructCommandPacket(CommandCodes commandCode,
                                   OutputIterator dest) {
  std::vector<unsigned char> decoded = {
    static_cast<unsigned char>(PacketHeaders::COMMAND),
    static_cast<unsigned char>(static_cast<unsigned short>(commandCode) >> 8),
    static_cast<unsigned char>(commandCode),
    0 };

  decoded.back() = checksum(decoded.begin(), decoded.size() - 1);
  PacketEncoding::encodePacket(decoded.begin(), decoded.end(), dest);
}